

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::to_visualize_mode(Application *this)

{
  Application *this_local;
  
  if (*(int *)&(this->super_Renderer).field_0xc != 3) {
    set_up_pathtracer(this);
    PathTracer::stop(this->pathtracer);
    PathTracer::start_visualizing(this->pathtracer);
    *(undefined4 *)&(this->super_Renderer).field_0xc = 3;
    setGhosted(this,false);
  }
  return;
}

Assistant:

void Application::to_visualize_mode() {
  if (mode == VISUALIZE_MODE) return;
  set_up_pathtracer();
  pathtracer->stop();
  pathtracer->start_visualizing();
  mode = VISUALIZE_MODE;
  setGhosted(false);
}